

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mod.c
# Opt level: O1

void ppSqrMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)(n * 0x10 + (long)stack);
  ppSqr((word *)stack,a,n,stack_00);
  ppMod(b,(word *)stack,n * 2,mod,n,stack_00);
  return;
}

Assistant:

void ppSqrMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	word* sqr = (word*)stack;
	stack = sqr + 2 * n;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(n > 0 && mod[n - 1] != 0);
	ASSERT(wwIsValid(b, n));
	// вычисления
	ppSqr(sqr, a, n, stack);
	ppMod(b, sqr, 2 * n, mod, n, stack);
}